

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

int CTcPrsOpUnary::parse_embedded_end_tok(CTcEmbedBuilder *b,CTcEmbedLevel *parent,char **open_kw)

{
  CTcEmbedTokenList *tl;
  int iVar1;
  
  tl = G_prs->embed_toks_;
  tl->wrt = tl->head;
  tl->cnt = 0;
  capture_embedded(b,tl);
  iVar1 = parse_embedded_end_tok(tl,parent,open_kw);
  CTcEmbedTokenList::unget(tl,0,0);
  return iVar1;
}

Assistant:

int CTcPrsOpUnary::parse_embedded_end_tok(CTcEmbedBuilder *b,
                                          CTcEmbedLevel *parent,
                                          const char **open_kw)
{
    /* capture the current expression's token list */
    CTcEmbedTokenList *tl = G_prs->embed_toks_;
    tl->reset();
    capture_embedded(b, tl);

    /* parse the end token */
    int ret = parse_embedded_end_tok(tl, parent, open_kw);

    /* un-get the captured tokens */
    tl->unget();

    /* return the result */
    return ret;
}